

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O2

bool cmFileAPI::ReadRequestVersions
               (Value *version,
               vector<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_>
               *versions,string *error)

{
  bool bVar1;
  Value *version_00;
  const_iterator cVar2;
  SelfType local_48;
  ValueIteratorBase local_38;
  
  bVar1 = Json::Value::isArray(version);
  if (bVar1) {
    cVar2 = Json::Value::begin(version);
    local_38.current_ = cVar2.super_ValueIteratorBase.current_._M_node;
    local_38.isNull_ = cVar2.super_ValueIteratorBase.isNull_;
    cVar2 = Json::Value::end(version);
    local_48.current_ = cVar2.super_ValueIteratorBase.current_._M_node;
    local_48.isNull_ = cVar2.super_ValueIteratorBase.isNull_;
    while (bVar1 = Json::ValueIteratorBase::operator!=(&local_38,&local_48), bVar1) {
      version_00 = Json::ValueIteratorBase::deref(&local_38);
      bVar1 = ReadRequestVersion(version_00,true,versions,error);
      if (!bVar1) {
        return false;
      }
      Json::ValueIteratorBase::increment(&local_38);
    }
  }
  else {
    bVar1 = ReadRequestVersion(version,false,versions,error);
    if (!bVar1) {
      return false;
    }
  }
  return true;
}

Assistant:

bool cmFileAPI::ReadRequestVersions(Json::Value const& version,
                                    std::vector<RequestVersion>& versions,
                                    std::string& error)
{
  if (version.isArray()) {
    for (Json::Value const& v : version) {
      if (!ReadRequestVersion(v, /*inArray=*/true, versions, error)) {
        return false;
      }
    }
  } else {
    if (!ReadRequestVersion(version, /*inArray=*/false, versions, error)) {
      return false;
    }
  }
  return true;
}